

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

bool IsConfSupported(KeyInfo *key,string *error)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  bool bVar3;
  Logger *pLVar4;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string local_60;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::operator==(&key->name,"conf");
  if (bVar2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (error,
               "conf cannot be set in the configuration file; use includeconf= if you want to include additional config files"
              );
  }
  else {
    bVar3 = std::operator==(&key->name,"reindex");
    if (bVar3) {
      pLVar4 = LogInstance();
      bVar3 = BCLog::Logger::Enabled(pLVar4);
      if (bVar3) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<>
                  (&local_60,
                   "Warning: reindex=1 is set in the configuration file, which will significantly slow down startup. Consider removing or commenting out this option for better performance, unless there is currently a condition which makes rebuilding the indexes necessary\n"
                  );
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        pLVar4 = LogInstance();
        local_60._M_dataplus._M_p = (pointer)0x5a;
        local_60._M_string_length = 0x71b2ae;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/config.cpp"
        ;
        source_file._M_len = 0x5a;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "IsConfSupported";
        logging_function._M_len = 0xf;
        BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0x56,ALL,Info);
        std::__cxx11::string::~string((string *)&log_msg);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return !bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool IsConfSupported(KeyInfo& key, std::string& error) {
    if (key.name == "conf") {
        error = "conf cannot be set in the configuration file; use includeconf= if you want to include additional config files";
        return false;
    }
    if (key.name == "reindex") {
        // reindex can be set in a config file but it is strongly discouraged as this will cause the node to reindex on
        // every restart. Allow the config but throw a warning
        LogPrintf("Warning: reindex=1 is set in the configuration file, which will significantly slow down startup. Consider removing or commenting out this option for better performance, unless there is currently a condition which makes rebuilding the indexes necessary\n");
        return true;
    }
    return true;
}